

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O3

void __thiscall
btAxisSweep3Internal<unsigned_short>::btAxisSweep3Internal
          (btAxisSweep3Internal<unsigned_short> *this,btVector3 *worldAabbMin,
          btVector3 *worldAabbMax,unsigned_short handleMask,unsigned_short handleSentinel,
          unsigned_short userMaxHandles,btOverlappingPairCache *pairCache,
          bool disableRaycastAccelerator)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Edge *pEVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  btHashedOverlappingPairCache *this_00;
  btOverlappingPairCache *pbVar13;
  btDbvtBroadphase *this_01;
  Handle *pHVar14;
  void *pvVar15;
  short *psVar16;
  ushort uVar17;
  Handle *pHVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  int iVar24;
  int iVar25;
  undefined1 auVar23 [16];
  int iVar26;
  short sVar27;
  float fVar28;
  undefined4 uVar29;
  short sVar30;
  undefined1 in_XMM1 [16];
  short sVar31;
  short sVar33;
  undefined1 auVar32 [16];
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  int iVar43;
  undefined1 auVar38 [16];
  int iVar44;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar58;
  int iVar62;
  int iVar63;
  int iVar64;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  
  uVar29 = in_XMM1._4_4_;
  (this->super_btBroadphaseInterface)._vptr_btBroadphaseInterface =
       (_func_int **)&PTR__btAxisSweep3Internal_0021adf0;
  this->m_bpHandleMask = handleMask;
  this->m_handleSentinel = handleSentinel;
  this->m_pairCache = pairCache;
  this->m_userPairCallback = (btOverlappingPairCallback *)0x0;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  this->m_raycastAccelerator = (btDbvtBroadphase *)0x0;
  uVar17 = userMaxHandles + 1;
  if (pairCache == (btOverlappingPairCache *)0x0) {
    this_00 = (btHashedOverlappingPairCache *)btAlignedAllocInternal(0x78,0x10);
    btHashedOverlappingPairCache::btHashedOverlappingPairCache(this_00);
    this->m_pairCache = (btOverlappingPairCache *)this_00;
    this->m_ownsPairCache = true;
  }
  if (!disableRaycastAccelerator) {
    pbVar13 = (btOverlappingPairCache *)btAlignedAllocInternal(0x28,0x10);
    pbVar13[3].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = (_func_int **)0x0;
    pbVar13[4].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = (_func_int **)0x0;
    pbVar13[1].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = (_func_int **)0x0;
    pbVar13[2].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = (_func_int **)0x0;
    (pbVar13->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback =
         (_func_int **)&PTR__btNullPairCache_0021ae70;
    *(undefined1 *)&pbVar13[4].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = 1;
    *(undefined4 *)
     ((long)&pbVar13[1].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback + 4) = 0;
    this->m_nullPairCache = pbVar13;
    this_01 = (btDbvtBroadphase *)btAlignedAllocInternal(0x120,0x10);
    btDbvtBroadphase::btDbvtBroadphase(this_01,this->m_nullPairCache);
    this->m_raycastAccelerator = this_01;
    this_01->m_deferedcollide = true;
  }
  uVar1 = *(undefined8 *)(worldAabbMin->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMin).m_floats = *(undefined8 *)worldAabbMin->m_floats;
  *(undefined8 *)((this->m_worldAabbMin).m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)(worldAabbMax->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMax).m_floats = *(undefined8 *)worldAabbMax->m_floats;
  *(undefined8 *)((this->m_worldAabbMax).m_floats + 2) = uVar1;
  fVar28 = (float)this->m_handleSentinel;
  uVar1 = *(undefined8 *)(this->m_worldAabbMin).m_floats;
  uVar2 = *(undefined8 *)(this->m_worldAabbMax).m_floats;
  auVar52._0_4_ = (float)uVar2 - (float)uVar1;
  auVar52._4_4_ = (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar1 >> 0x20);
  auVar52._8_8_ = 0;
  auVar32._4_4_ = uVar29;
  auVar32._0_4_ = fVar28;
  auVar32._8_4_ = uVar29;
  auVar32._12_4_ = uVar29;
  auVar38._8_8_ = auVar32._8_8_;
  auVar38._4_4_ = fVar28;
  auVar38._0_4_ = fVar28;
  auVar32 = divps(auVar38,auVar52);
  auVar45._0_8_ = auVar32._0_8_;
  auVar45._8_4_ = fVar28 / ((this->m_worldAabbMax).m_floats[2] - (this->m_worldAabbMin).m_floats[2])
  ;
  auVar45._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_quantize).m_floats = auVar45;
  uVar20 = (uint)uVar17;
  pHVar14 = (Handle *)btAlignedAllocInternal((ulong)uVar17 * 0x50,0x10);
  if (uVar17 == 0) {
    this->m_pHandles = pHVar14;
    this->m_maxHandles = 0;
    this->m_numHandles = 0;
    this->m_firstFreeHandle = 1;
  }
  else {
    pHVar18 = pHVar14;
    do {
      (pHVar18->super_btBroadphaseProxy).m_clientObject = (void *)0x0;
      (pHVar18->super_btBroadphaseProxy).m_multiSapParentProxy = (void *)0x0;
      pHVar18 = pHVar18 + 1;
    } while (pHVar18 !=
             (Handle *)
             ((long)(pHVar14->super_btBroadphaseProxy).m_aabbMin.m_floats +
             ((ulong)(uVar20 * 0x50) - 0x1c)));
    this->m_pHandles = pHVar14;
    this->m_maxHandles = uVar17;
    this->m_numHandles = 0;
    this->m_firstFreeHandle = 1;
    auVar32 = _DAT_001ee270;
    if (userMaxHandles != 0) {
      lVar21 = (ulong)uVar20 - 2;
      auVar23._8_4_ = (int)lVar21;
      auVar23._0_8_ = lVar21;
      auVar23._12_4_ = (int)((ulong)lVar21 >> 0x20);
      psVar16 = (short *)&pHVar14[1].super_btBroadphaseProxy.field_0x3c;
      sVar27 = 7;
      sVar30 = 8;
      sVar31 = 5;
      sVar33 = 6;
      sVar34 = 3;
      sVar35 = 4;
      sVar36 = 1;
      sVar37 = 2;
      uVar19 = 0;
      auVar23 = auVar23 ^ _DAT_001ee270;
      do {
        auVar54._8_4_ = (int)uVar19;
        auVar54._0_8_ = uVar19;
        auVar54._12_4_ = (int)(uVar19 >> 0x20);
        auVar38 = (auVar54 | _DAT_001ee5d0) ^ auVar32;
        iVar22 = auVar23._0_4_;
        iVar58 = -(uint)(iVar22 < auVar38._0_4_);
        iVar24 = auVar23._4_4_;
        iVar62 = -(uint)(iVar24 < auVar38._4_4_);
        iVar25 = auVar23._8_4_;
        iVar63 = -(uint)(iVar25 < auVar38._8_4_);
        iVar26 = auVar23._12_4_;
        iVar64 = -(uint)(iVar26 < auVar38._12_4_);
        auVar8._4_4_ = iVar58;
        auVar8._0_4_ = iVar58;
        auVar8._8_4_ = iVar63;
        auVar8._12_4_ = iVar63;
        auVar45 = pshuflw(in_XMM6,auVar8,0xe8);
        iVar43 = -(uint)(auVar38._4_4_ == iVar24);
        iVar44 = -(uint)(auVar38._12_4_ == iVar26);
        auVar56._4_4_ = iVar43;
        auVar56._0_4_ = iVar43;
        auVar56._8_4_ = iVar44;
        auVar56._12_4_ = iVar44;
        auVar52 = pshuflw(in_XMM7,auVar56,0xe8);
        auVar57._4_4_ = iVar62;
        auVar57._0_4_ = iVar62;
        auVar57._8_4_ = iVar64;
        auVar57._12_4_ = iVar64;
        auVar38 = pshuflw(auVar45,auVar57,0xe8);
        auVar46._8_4_ = 0xffffffff;
        auVar46._0_8_ = 0xffffffffffffffff;
        auVar46._12_4_ = 0xffffffff;
        auVar46 = (auVar38 | auVar52 & auVar45) ^ auVar46;
        auVar38 = packssdw(auVar46,auVar46);
        if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *psVar16 = sVar36 + 1;
        }
        auVar9._4_4_ = iVar58;
        auVar9._0_4_ = iVar58;
        auVar9._8_4_ = iVar63;
        auVar9._12_4_ = iVar63;
        auVar57 = auVar56 & auVar9 | auVar57;
        auVar38 = packssdw(auVar57,auVar57);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar38 = packssdw(auVar38 ^ auVar4,auVar38 ^ auVar4);
        if ((auVar38._0_4_ >> 0x10 & 1) != 0) {
          psVar16[0x28] = sVar37 + 1;
        }
        auVar38 = (auVar54 | _DAT_001ee5c0) ^ auVar32;
        auVar47._0_4_ = -(uint)(iVar22 < auVar38._0_4_);
        auVar47._4_4_ = -(uint)(iVar24 < auVar38._4_4_);
        auVar47._8_4_ = -(uint)(iVar25 < auVar38._8_4_);
        auVar47._12_4_ = -(uint)(iVar26 < auVar38._12_4_);
        auVar59._4_4_ = auVar47._0_4_;
        auVar59._0_4_ = auVar47._0_4_;
        auVar59._8_4_ = auVar47._8_4_;
        auVar59._12_4_ = auVar47._8_4_;
        auVar39._4_4_ = -(uint)(auVar38._4_4_ == iVar24);
        auVar39._12_4_ = -(uint)(auVar38._12_4_ == iVar26);
        auVar39._0_4_ = auVar39._4_4_;
        auVar39._8_4_ = auVar39._12_4_;
        auVar53._4_4_ = auVar47._4_4_;
        auVar53._0_4_ = auVar47._4_4_;
        auVar53._8_4_ = auVar47._12_4_;
        auVar53._12_4_ = auVar47._12_4_;
        auVar53 = auVar39 & auVar59 | auVar53;
        auVar38 = packssdw(auVar47,auVar53);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar38 = packssdw(auVar38 ^ auVar5,auVar38 ^ auVar5);
        if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar16[0x50] = sVar34 + 1;
        }
        auVar45 = pshufhw(auVar38,auVar59,0x84);
        auVar38 = pshufhw(auVar39,auVar39,0x84);
        auVar10._4_4_ = auVar47._4_4_;
        auVar10._0_4_ = auVar47._4_4_;
        auVar10._8_4_ = auVar47._12_4_;
        auVar10._12_4_ = auVar47._12_4_;
        auVar52 = pshufhw(auVar45,auVar10,0x84);
        auVar48._8_4_ = 0xffffffff;
        auVar48._0_8_ = 0xffffffffffffffff;
        auVar48._12_4_ = 0xffffffff;
        auVar48 = (auVar52 | auVar38 & auVar45) ^ auVar48;
        auVar38 = packssdw(auVar48,auVar48);
        if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar16[0x78] = sVar35 + 1;
        }
        auVar38 = (auVar54 | _DAT_001ee810) ^ auVar32;
        auVar49._0_4_ = -(uint)(iVar22 < auVar38._0_4_);
        auVar49._4_4_ = -(uint)(iVar24 < auVar38._4_4_);
        auVar49._8_4_ = -(uint)(iVar25 < auVar38._8_4_);
        auVar49._12_4_ = -(uint)(iVar26 < auVar38._12_4_);
        auVar11._4_4_ = auVar49._0_4_;
        auVar11._0_4_ = auVar49._0_4_;
        auVar11._8_4_ = auVar49._8_4_;
        auVar11._12_4_ = auVar49._8_4_;
        auVar45 = pshuflw(auVar53,auVar11,0xe8);
        iVar43 = -(uint)(auVar38._4_4_ == iVar24);
        iVar44 = -(uint)(auVar38._12_4_ == iVar26);
        auVar60._4_4_ = iVar43;
        auVar60._0_4_ = iVar43;
        auVar60._8_4_ = iVar44;
        auVar60._12_4_ = iVar44;
        in_XMM8 = pshuflw(in_XMM8,auVar60,0xe8);
        in_XMM8 = in_XMM8 & auVar45;
        auVar40._4_4_ = auVar49._4_4_;
        auVar40._0_4_ = auVar49._4_4_;
        auVar40._8_4_ = auVar49._12_4_;
        auVar40._12_4_ = auVar49._12_4_;
        auVar38 = pshuflw(auVar49,auVar40,0xe8);
        auVar50._8_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff;
        auVar50._12_4_ = 0xffffffff;
        auVar50 = (auVar38 | in_XMM8) ^ auVar50;
        auVar38 = packssdw(auVar50,auVar50);
        if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar16[0xa0] = sVar31 + 1;
        }
        auVar12._4_4_ = auVar49._0_4_;
        auVar12._0_4_ = auVar49._0_4_;
        auVar12._8_4_ = auVar49._8_4_;
        auVar12._12_4_ = auVar49._8_4_;
        auVar38 = auVar60 & auVar12 | auVar40;
        auVar38 = packssdw(auVar38,auVar38);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar38 = packssdw(auVar40,auVar38 ^ auVar6);
        if ((auVar38 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          psVar16[200] = sVar33 + 1;
        }
        auVar38 = (auVar54 | _DAT_001ee800) ^ auVar32;
        auVar51._0_4_ = -(uint)(iVar22 < auVar38._0_4_);
        auVar51._4_4_ = -(uint)(iVar24 < auVar38._4_4_);
        auVar51._8_4_ = -(uint)(iVar25 < auVar38._8_4_);
        auVar51._12_4_ = -(uint)(iVar26 < auVar38._12_4_);
        auVar41._4_4_ = auVar51._0_4_;
        auVar41._0_4_ = auVar51._0_4_;
        auVar41._8_4_ = auVar51._8_4_;
        auVar41._12_4_ = auVar51._8_4_;
        auVar55._4_4_ = -(uint)(auVar38._4_4_ == iVar24);
        auVar55._12_4_ = -(uint)(auVar38._12_4_ == iVar26);
        auVar55._0_4_ = auVar55._4_4_;
        auVar55._8_4_ = auVar55._12_4_;
        auVar61._4_4_ = auVar51._4_4_;
        auVar61._0_4_ = auVar51._4_4_;
        auVar61._8_4_ = auVar51._12_4_;
        auVar61._12_4_ = auVar51._12_4_;
        in_XMM7 = auVar55 & auVar41 | auVar61;
        auVar38 = packssdw(auVar51,in_XMM7);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar38 = packssdw(auVar38 ^ auVar7,auVar38 ^ auVar7);
        if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar16[0xf0] = sVar27 + 1;
        }
        auVar45 = pshufhw(auVar41,auVar41,0x84);
        in_XMM6 = pshufhw(auVar38,auVar55,0x84);
        in_XMM6 = in_XMM6 & auVar45;
        auVar38 = pshufhw(auVar45,auVar61,0x84);
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar42 = (auVar38 | in_XMM6) ^ auVar42;
        auVar38 = packssdw(auVar42,auVar42);
        if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar16[0x118] = sVar30 + 1;
        }
        uVar19 = uVar19 + 8;
        sVar36 = sVar36 + 8;
        sVar37 = sVar37 + 8;
        sVar34 = sVar34 + 8;
        sVar35 = sVar35 + 8;
        sVar31 = sVar31 + 8;
        sVar33 = sVar33 + 8;
        sVar27 = sVar27 + 8;
        sVar30 = sVar30 + 8;
        psVar16 = psVar16 + 0x140;
      } while ((uVar20 + 6 & 0xfffffff8) != uVar19);
    }
  }
  *(undefined2 *)
   ((long)(&(pHVar14->super_btBroadphaseProxy).m_aabbMin + -3) + (ulong)(uVar20 * 0x50)) = 0;
  lVar21 = -3;
  do {
    pvVar15 = btAlignedAllocInternal((ulong)(uVar20 * 8),0x10);
    this->m_pEdgesRawPtr[lVar21 + 3] = pvVar15;
    this->m_pEdgesRawPtr[lVar21] = pvVar15;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0);
  pHVar14 = this->m_pHandles;
  (pHVar14->super_btBroadphaseProxy).m_clientObject = (void *)0x0;
  lVar21 = 0;
  do {
    pHVar14->m_maxEdges[lVar21 + -3] = 0;
    pHVar14->m_maxEdges[lVar21] = 1;
    pEVar3 = this->m_pEdges[lVar21];
    pEVar3->m_pos = 0;
    pEVar3->m_handle = 0;
    pEVar3[1].m_pos = this->m_handleSentinel;
    pEVar3[1].m_handle = 0;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 3);
  return;
}

Assistant:

btAxisSweep3Internal<BP_FP_INT_TYPE>::btAxisSweep3Internal(const btVector3& worldAabbMin,const btVector3& worldAabbMax, BP_FP_INT_TYPE handleMask, BP_FP_INT_TYPE handleSentinel,BP_FP_INT_TYPE userMaxHandles, btOverlappingPairCache* pairCache , bool disableRaycastAccelerator)
:m_bpHandleMask(handleMask),
m_handleSentinel(handleSentinel),
m_pairCache(pairCache),
m_userPairCallback(0),
m_ownsPairCache(false),
m_invalidPair(0),
m_raycastAccelerator(0)
{
	BP_FP_INT_TYPE maxHandles = static_cast<BP_FP_INT_TYPE>(userMaxHandles+1);//need to add one sentinel handle

	if (!m_pairCache)
	{
		void* ptr = btAlignedAlloc(sizeof(btHashedOverlappingPairCache),16);
		m_pairCache = new(ptr) btHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	if (!disableRaycastAccelerator)
	{
		m_nullPairCache = new (btAlignedAlloc(sizeof(btNullPairCache),16)) btNullPairCache();
		m_raycastAccelerator = new (btAlignedAlloc(sizeof(btDbvtBroadphase),16)) btDbvtBroadphase(m_nullPairCache);//m_pairCache);
		m_raycastAccelerator->m_deferedcollide = true;//don't add/remove pairs
	}

	//btAssert(bounds.HasVolume());

	// init bounds
	m_worldAabbMin = worldAabbMin;
	m_worldAabbMax = worldAabbMax;

	btVector3 aabbSize = m_worldAabbMax - m_worldAabbMin;

	BP_FP_INT_TYPE	maxInt = m_handleSentinel;

	m_quantize = btVector3(btScalar(maxInt),btScalar(maxInt),btScalar(maxInt)) / aabbSize;

	// allocate handles buffer, using btAlignedAlloc, and put all handles on free list
	m_pHandles = new Handle[maxHandles];
	
	m_maxHandles = maxHandles;
	m_numHandles = 0;

	// handle 0 is reserved as the null index, and is also used as the sentinel
	m_firstFreeHandle = 1;
	{
		for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < maxHandles; i++)
			m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
		m_pHandles[maxHandles - 1].SetNextFree(0);
	}

	{
		// allocate edge buffers
		for (int i = 0; i < 3; i++)
		{
			m_pEdgesRawPtr[i] = btAlignedAlloc(sizeof(Edge)*maxHandles*2,16);
			m_pEdges[i] = new(m_pEdgesRawPtr[i]) Edge[maxHandles * 2];
		}
	}
	//removed overlap management

	// make boundary sentinels
	
	m_pHandles[0].m_clientObject = 0;

	for (int axis = 0; axis < 3; axis++)
	{
		m_pHandles[0].m_minEdges[axis] = 0;
		m_pHandles[0].m_maxEdges[axis] = 1;

		m_pEdges[axis][0].m_pos = 0;
		m_pEdges[axis][0].m_handle = 0;
		m_pEdges[axis][1].m_pos = m_handleSentinel;
		m_pEdges[axis][1].m_handle = 0;
#ifdef DEBUG_BROADPHASE
		debugPrintAxis(axis);
#endif //DEBUG_BROADPHASE

	}

}